

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultOutputSkew(ClockingBlockSymbol *this)

{
  Scope *pSVar1;
  LookupLocation LVar2;
  ClockingSkew CVar3;
  Scope *local_48;
  uint32_t local_40;
  SyntaxNode *local_38;
  Token TStack_30;
  TimingControlSyntax *pTStack_20;
  undefined8 local_18;
  
  if ((this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == false) {
    if (this->outputSkewSyntax == (ClockingSkewSyntax *)0x0) {
      *(undefined8 *)
       &(this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload = 0;
      (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay =
           (TimingControl *)0x0;
    }
    else {
      pSVar1 = (this->super_Symbol).parentScope;
      LVar2 = LookupLocation::before(&this->super_Symbol);
      local_40 = LVar2.index;
      local_38 = (SyntaxNode *)0x0;
      TStack_30.kind = Unknown;
      TStack_30._2_1_ = 0;
      TStack_30.numFlags.raw = '\0';
      TStack_30.rawLen = 0;
      TStack_30.info = (Info *)0x0;
      pTStack_20 = (TimingControlSyntax *)0x0;
      local_18 = 0;
      local_48 = pSVar1;
      CVar3 = ClockingSkew::fromSyntax
                        ((ClockingSkew *)this->outputSkewSyntax,(ClockingSkewSyntax *)&local_48,
                         LVar2._8_8_);
      (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.edge =
           CVar3.edge;
      (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay =
           CVar3.delay;
      if ((this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged != false)
      goto LAB_0020977f;
    }
    (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
  }
LAB_0020977f:
  CVar3._4_4_ = 0;
  CVar3.edge = (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
               _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value
               .edge;
  CVar3.delay = (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>
                ._M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload.
                _M_value.delay;
  return CVar3;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultOutputSkew() const {
    if (!defaultOutputSkew) {
        if (outputSkewSyntax) {
            auto scope = getParentScope();
            SLANG_ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultOutputSkew = ClockingSkew::fromSyntax(*outputSkewSyntax, context);
        }
        else {
            defaultOutputSkew.emplace();
        }
    }
    return *defaultOutputSkew;
}